

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O2

ssize_t __thiscall
FIX::SocketConnection::read(SocketConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 unaff_RBP;
  ulong uVar1;
  undefined4 in_register_00000034;
  
  if (this->m_pSession == (Session *)0x0) {
    uVar1 = 0;
  }
  else {
    readFromSocket(this);
    uVar1 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    readMessages(this,(SocketMonitor *)CONCAT44(in_register_00000034,__fd));
  }
  return uVar1 & 0xffffffff;
}

Assistant:

bool SocketConnection::read(SocketConnector &s) {
  if (!m_pSession) {
    return false;
  }

  try {
    readFromSocket();
    readMessages(s.getMonitor());
  } catch (SocketRecvFailed &e) {
    m_pSession->getLog()->onEvent(e.what());
    return false;
  }
  return true;
}